

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kkt_solver_basis.cc
# Opt level: O1

void __thiscall ipx::KKTSolverBasis::DropPrimal(KKTSolverBasis *this,Iterate *iterate,Info *info)

{
  ipxint *piVar1;
  double dVar2;
  uint dim;
  int iVar3;
  int iVar4;
  Basis *pBVar5;
  pointer piVar6;
  double *pdVar7;
  bool bVar8;
  Info *pIVar9;
  bool bVar10;
  Int IVar11;
  void *__s;
  ostream *poVar12;
  int iVar13;
  fmtflags jn;
  fmtflags floatfield;
  long lVar14;
  long lVar15;
  ulong uVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  vector<int,_std::allocator<int>_> candidates;
  Int jb;
  IndexedVector row;
  IndexedVector btran;
  int *local_108;
  iterator iStack_100;
  int *local_f8;
  Iterate *local_e8;
  Info *local_e0;
  double local_d8;
  undefined8 uStack_d0;
  string local_c8;
  IndexedVector local_a8;
  double local_78;
  undefined8 uStack_70;
  IndexedVector local_60;
  
  dim = this->model_->num_rows_;
  iVar3 = this->model_->num_cols_;
  local_e8 = iterate;
  IndexedVector::IndexedVector(&local_60,dim);
  IndexedVector::IndexedVector(&local_a8,iVar3 + dim);
  local_d8 = (this->control_->parameters_).super_ipx_parameters.ipm_drop_primal;
  (info->super_ipx_info).errflag = 0;
  local_108 = (int *)0x0;
  iStack_100._M_current = (int *)0x0;
  local_f8 = (int *)0x0;
  if (0 < (int)dim) {
    uVar16 = 0;
    do {
      pBVar5 = this->basis_;
      local_c8._M_dataplus._M_p._0_4_ =
           (pBVar5->basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[uVar16];
      iVar3 = (pBVar5->map2basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[(int)local_c8._M_dataplus._M_p];
      if ((-1 < iVar3) && (iVar3 < pBVar5->model_->num_rows_)) {
        dVar17 = (local_e8->xl_)._M_data[(int)local_c8._M_dataplus._M_p];
        dVar20 = (local_e8->xu_)._M_data[(int)local_c8._M_dataplus._M_p];
        dVar2 = dVar20;
        if (dVar20 >= dVar17) {
          dVar2 = dVar17;
        }
        if ((dVar2 <= local_d8) &&
           (dVar2 < (&local_e8->zl_)[dVar20 < dVar17]._M_data[(int)local_c8._M_dataplus._M_p] * 0.01
           )) {
          if (iStack_100._M_current == local_f8) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_108,iStack_100,(int *)&local_c8);
          }
          else {
            *iStack_100._M_current = (int)local_c8._M_dataplus._M_p;
            iStack_100._M_current = iStack_100._M_current + 1;
          }
        }
      }
      uVar16 = uVar16 + 1;
    } while (dim != uVar16);
  }
  if (local_108 != iStack_100._M_current) {
    __s = operator_new((long)(int)dim << 3);
    memset(__s,0,(long)(int)dim << 3);
    if (0 < (int)dim) {
      piVar6 = (this->basis_->basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (this->colscale_)._M_data;
      uVar16 = 0;
      do {
        *(double *)((long)__s + uVar16 * 8) = 1.0 / pdVar7[piVar6[uVar16]];
        uVar16 = uVar16 + 1;
      } while (dim != uVar16);
    }
    pIVar9 = info;
    if (local_108 != iStack_100._M_current) {
      do {
        local_e0 = pIVar9;
        iVar3 = iStack_100._M_current[-1];
        pBVar5 = this->basis_;
        iVar13 = pBVar5->model_->num_rows_;
        iVar4 = (pBVar5->map2basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar3];
        if (iVar4 < iVar13) {
          iVar13 = 0;
        }
        iVar13 = iVar4 - iVar13;
        if (iVar4 < 0) {
          iVar13 = -1;
        }
        lVar15 = (long)iVar13;
        local_d8 = *(double *)((long)__s + lVar15 * 8);
        floatfield = _S_boolalpha;
        Basis::TableauRow(pBVar5,iVar3,&local_60,&local_a8,true);
        bVar10 = IndexedVector::sparse(&local_a8);
        if (bVar10) {
          if ((long)local_a8.nnz_ < 1) {
LAB_003a6393:
            jn = _S_ios_fmtflags_min|_S_ios_fmtflags_max;
          }
          else {
            jn = _S_ios_fmtflags_min|_S_ios_fmtflags_max;
            dVar17 = 2.0;
            lVar14 = 0;
            do {
              floatfield = local_a8.pattern_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar14];
              if ((1e-07 < ABS(local_a8.elements_._M_data[floatfield])) &&
                 (dVar20 = ABS(local_a8.elements_._M_data[floatfield]) *
                           (this->colscale_)._M_data[floatfield] * local_d8, dVar17 < dVar20)) {
                jn = floatfield;
                dVar17 = dVar20;
              }
              lVar14 = lVar14 + 1;
            } while (local_a8.nnz_ != lVar14);
          }
        }
        else {
          if ((int)(uint)local_a8.elements_._M_size < 1) goto LAB_003a6393;
          jn = _S_ios_fmtflags_min|_S_ios_fmtflags_max;
          dVar17 = 2.0;
          uVar16 = 0;
          do {
            if ((1e-07 < ABS(local_a8.elements_._M_data[uVar16])) &&
               (dVar20 = ABS(local_a8.elements_._M_data[uVar16]) * (this->colscale_)._M_data[uVar16]
                         * local_d8, dVar17 < dVar20)) {
              jn = (fmtflags)uVar16;
              dVar17 = dVar20;
            }
            uVar16 = uVar16 + 1;
          } while (((uint)local_a8.elements_._M_size & 0x7fffffff) != uVar16);
        }
        if (jn < ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max)) {
          auVar18._8_8_ = (local_e8->zu_)._M_data[iVar3];
          auVar18._0_8_ = (local_e8->zl_)._M_data[iVar3];
          auVar19._8_8_ = (local_e8->xu_)._M_data[iVar3];
          auVar19._0_8_ = (local_e8->xl_)._M_data[iVar3];
          auVar19 = divpd(auVar18,auVar19);
          if (auVar19._0_8_ <= auVar19._8_8_) {
            Iterate::make_implied_ub(local_e8,iVar3);
          }
          else {
            Iterate::make_implied_lb(local_e8,iVar3);
          }
          pIVar9 = local_e0;
          Basis::FreeBasicVariable(this->basis_,iVar3);
          *(undefined8 *)((long)__s + lVar15 * 8) = 0;
          (this->colscale_)._M_data[iVar3] = INFINITY;
          piVar1 = &(pIVar9->super_ipx_info).primal_dropped;
          *piVar1 = *piVar1 + 1;
LAB_003a656b:
          iStack_100._M_current = iStack_100._M_current + -1;
          bVar10 = false;
        }
        else {
          local_d8 = local_a8.elements_._M_data[(uint)jn];
          uStack_d0 = 0;
          local_78 = ABS(local_d8);
          uStack_70 = 0;
          if (local_78 < 0.001) {
            poVar12 = Control::Debug(this->control_,3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12," |pivot| = ",0xb);
            Format_abi_cxx11_(&local_c8,(ipx *)0x0,local_78,2,0x100,floatfield);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,(char *)CONCAT44(local_c8._M_dataplus._M_p._4_4_,
                                                          (int)local_c8._M_dataplus._M_p),
                                 local_c8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12," (primal basic variable close to bound)\n",0x28);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_c8._M_dataplus._M_p._4_4_,(int)local_c8._M_dataplus._M_p) !=
                &local_c8.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_c8._M_dataplus._M_p._4_4_,
                                       (int)local_c8._M_dataplus._M_p));
            }
          }
          IVar11 = Basis::ExchangeIfStable(this->basis_,iVar3,jn,local_d8,1,(bool *)&local_c8);
          (local_e0->super_ipx_info).errflag = IVar11;
          if (IVar11 == 0) {
            bVar10 = false;
            if ((char)local_c8._M_dataplus._M_p != '\x01') {
              bVar10 = false;
              goto LAB_003a6560;
            }
            *(double *)((long)__s + lVar15 * 8) = 1.0 / (this->colscale_)._M_data[(uint)jn];
            piVar1 = &(local_e0->super_ipx_info).updates_ipm;
            *piVar1 = *piVar1 + 1;
            this->basis_changes_ = this->basis_changes_ + 1;
            bVar8 = true;
          }
          else {
            bVar10 = true;
LAB_003a6560:
            bVar8 = false;
          }
          if (bVar8) goto LAB_003a656b;
        }
      } while ((!bVar10) && (pIVar9 = local_e0, local_108 != iStack_100._M_current));
    }
    operator_delete(__s);
  }
  if (local_108 != (int *)0x0) {
    operator_delete(local_108);
  }
  if (local_a8.pattern_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.pattern_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  operator_delete(local_a8.elements_._M_data);
  if (local_60.pattern_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.pattern_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  operator_delete(local_60.elements_._M_data);
  return;
}

Assistant:

void KKTSolverBasis::DropPrimal(Iterate* iterate, Info* info) {
    const Int m = model_.rows();
    const Int n = model_.cols();
    const Vector& xl = iterate->xl();
    const Vector& xu = iterate->xu();
    const Vector& zl = iterate->zl();
    const Vector& zu = iterate->zu();
    IndexedVector btran(m), row(n+m);
    const double drop_primal = control_.ipm_drop_primal();
    const double volume_tol = 2.0;
    info->errflag = 0;

    std::vector<Int> candidates;
    for (Int p = 0; p < m; p++) {
        Int jb = basis_[p];
        if (basis_.StatusOf(jb) != Basis::BASIC) // ignore free variables
            continue;
        assert(std::isfinite(xl[jb]) || std::isfinite(xu[jb]));
        assert(xl[jb] > 0.0);
        assert(xu[jb] > 0.0);
        double xj, zj;          // choose which bound is nearer
        if (xl[jb] <= xu[jb]) {
            xj = xl[jb];
            zj = zl[jb];
        } else {
            xj = xu[jb];
            zj = zu[jb];
        }
        if (xj < 0.01*zj && xj <= drop_primal)
            candidates.push_back(jb);
    }
    if (candidates.empty())
        return;

    // Maintain a copy of the inverse scaling factors of basic variables for
    // faster access.
    Vector invscale_basic(m);
    for (Int p = 0; p < m; p++) {
        Int j = basis_[p];
        invscale_basic[p] = 1.0 / colscale_[j];
        assert(std::isfinite(invscale_basic[p]));
        assert(invscale_basic[p] >= 0.0);
    }

    while (!candidates.empty()) {
        Int jb = candidates.back();
        Int p = basis_.PositionOf(jb);
        assert(p >= 0);
        // Pivot jb out of the basis if the volume increase sufficiently.
        const double s = invscale_basic[p];
        basis_.TableauRow(jb, btran, row, true);
        Int jmax = -1;
        double vmax = volume_tol;
        auto search_pivot = [&](Int j, double pivot) {
            pivot = std::abs(pivot);
            if (pivot > kPivotZeroTol) {
                double v = pivot * colscale_[j] * s;
                if (v > vmax) {
                    vmax = v;
                    jmax = j;
                }
            }
        };
        for_each_nonzero(row, search_pivot);
        if (jmax >= 0) {
            // Pivot jb out of the basis.
            double pivot = row[jmax];
            if (std::abs(pivot) < 1e-3)
                control_.Debug(3)
                    << " |pivot| = " << sci2(std::abs(pivot))
                    << " (primal basic variable close to bound)\n";
            assert(basis_.StatusOf(jmax) == Basis::NONBASIC);
            bool exchanged;
            info->errflag = basis_.ExchangeIfStable(jb, jmax, pivot, 1,
                                                    &exchanged);
            if (info->errflag)
                return;
            if (!exchanged)     // factorization was unstable, try again
                continue;
            invscale_basic[p] = 1.0 / colscale_[jmax];
            assert(std::isfinite(invscale_basic[p]));
            assert(invscale_basic[p] >= 0.0);
            info->updates_ipm++;
            basis_changes_++;
        } else {
            // Make variable jb "implied" at a bound.
            if (zl[jb]/xl[jb] > zu[jb]/xu[jb])
                iterate->make_implied_lb(jb);
            else
                iterate->make_implied_ub(jb);
            basis_.FreeBasicVariable(jb);
            invscale_basic[p] = 0.0;
            colscale_[jb] = INFINITY;
            info->primal_dropped++;
        }
        candidates.pop_back();
    }
}